

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

void __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::~ProtoSignal
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this)

{
  char *in_RSI;
  SignalLink *in_RDI;
  
  if (in_RDI->next != (SignalLink *)0x0) {
    while (in_RDI->next->next != in_RDI->next) {
      SignalLink::unlink(in_RDI->next->next,in_RSI);
    }
    SignalLink::decref(in_RDI);
    SignalLink::decref(in_RDI);
  }
  return;
}

Assistant:

~ProtoSignal() {
    if (callback_ring_) {
      while (callback_ring_->next != callback_ring_)
        callback_ring_->next->unlink();
      assert(callback_ring_->ref_count >= 2);
      callback_ring_->decref();
      callback_ring_->decref();
    }
  }